

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Low_options>::
rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (Simplex_tree<Low_options> *this,Siblings *sib,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                last,Filtration_value *filt)

{
  reference ppVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last_00;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
  pVar3;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool>
  pVar4;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>,_bool>
  insertion_result;
  undefined1 local_50 [32];
  undefined8 uVar2;
  
  last_00._M_current = last._M_current + 1;
  if ((Filtration_value *)last_00._M_current == filt) {
    pVar4 = insert_node_<true,false,true,double_const&>
                      ((Simplex_tree<Low_options> *)local_50,sib,(Vertex_handle)first._M_current,
                       (double *)(ulong)*last._M_current);
    uVar2 = pVar4._8_8_;
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)local_50._0_8_;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = local_50[8];
  }
  else {
    insert_node_<true,true,false,double_const&>
              ((Simplex_tree<Low_options> *)local_50,sib,(Vertex_handle)first._M_current,
               (double *)(ulong)*last._M_current);
    ppVar1 = boost::container::dtl::
             iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
             ::operator*((iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_false>
                          *)local_50);
    pVar3 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      (this,sib,(__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 )(ppVar1->second).children_,last_00,filt);
    uVar2 = pVar3._8_8_;
    if ((this->nodes_label_to_list_)._M_h._M_buckets != (__buckets_ptr)0x0) {
      pVar3 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((Simplex_tree<Low_options> *)(local_50 + 0x10),sib,first,last_00,filt);
      uVar2 = pVar3._8_8_;
    }
  }
  pVar3._8_8_ = uVar2;
  pVar3.first.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_unsigned_char,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Low_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )this;
  return pVar3;
}

Assistant:

std::pair<Simplex_handle, bool> rec_insert_simplex_and_subfaces_sorted(Siblings* sib,
                                                                         ForwardVertexIterator first,
                                                                         ForwardVertexIterator last,
                                                                         const Filtration_value& filt)
  {
    // An alternative strategy would be:
    // - try to find the complete simplex, if found (and low filtration) exit
    // - insert all the vertices at once in sib
    // - loop over those (new or not) simplices, with a recursive call(++first, last)
    Vertex_handle vertex_one = *first;

    if (++first == last) return insert_node_<true, false, true>(sib, vertex_one, filt);

    // TODO: have special code here, we know we are building the whole subtree from scratch.
    auto insertion_result = insert_node_<true, true, false>(sib, vertex_one, filt);

    auto res = rec_insert_simplex_and_subfaces_sorted(insertion_result.first->second.children(), first, last, filt);
    // No need to continue if the full simplex was already there with a low enough filtration value.
    if (res.first != null_simplex()) rec_insert_simplex_and_subfaces_sorted(sib, first, last, filt);
    return res;
  }